

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrestaccessmanager_p.h
# Opt level: O0

QNetworkReply * __thiscall
QRestAccessManagerPrivate::executeRequest
          (QRestAccessManagerPrivate *this,ReqOpRefJson requestOperation,QJsonDocument *jsonDoc,
          QNetworkRequest *request,QObject *context,QSlotObjectBase *rawSlot)

{
  long lVar1;
  QLatin1StringView str;
  QAnyStringView value;
  bool bVar2;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_RCX;
  QHttpHeaders *in_RDI;
  long in_FS_OFFSET;
  QNetworkReply *reply;
  QNetworkReply *in_stack_00000038;
  QHttpHeaders h;
  QNetworkRequest req;
  SlotObjUniquePtr slot;
  QRestAccessManagerPrivate *in_stack_ffffffffffffff28;
  QHttpHeadersPrivate *in_stack_ffffffffffffff30;
  QAnyStringView *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  WellKnownHeader in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  WellKnownHeader in_stack_ffffffffffffff4c;
  QHttpHeaders *pQVar3;
  QNetworkReply *local_78;
  undefined1 local_68 [24];
  SlotObjUniquePtr *in_stack_ffffffffffffffb0;
  QObject *in_stack_ffffffffffffffb8;
  QRestAccessManagerPrivate *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = in_RDI;
  std::unique_ptr<QtPrivate::QSlotObjectBase,QtPrivate::QSlotObjectBase::Deleter>::
  unique_ptr<QtPrivate::QSlotObjectBase::Deleter,void>
            ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
             in_stack_ffffffffffffff30,(pointer)in_stack_ffffffffffffff28);
  if (in_RDI[0x10].d.d.ptr == (QHttpHeadersPrivate *)0x0) {
    local_78 = warnNoAccessManager(in_stack_ffffffffffffff28);
  }
  else {
    verifyThreadAffinity
              ((QRestAccessManagerPrivate *)
               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
               (QObject *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    QNetworkRequest::QNetworkRequest
              ((QNetworkRequest *)in_stack_ffffffffffffff30,
               (QNetworkRequest *)in_stack_ffffffffffffff28);
    QNetworkRequest::headers((QNetworkRequest *)in_stack_ffffffffffffff38);
    bVar2 = QHttpHeaders::contains(in_RDI,in_stack_ffffffffffffff4c);
    if (!bVar2) {
      QLatin1String::QLatin1String
                ((QLatin1String *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 (char *)in_stack_ffffffffffffff38);
      str.m_size._4_4_ = in_stack_ffffffffffffff44;
      str.m_size._0_4_ = in_stack_ffffffffffffff40;
      str.m_data._0_4_ = in_stack_ffffffffffffff48;
      str.m_data._4_4_ = in_stack_ffffffffffffff4c;
      QAnyStringView::QAnyStringView(in_stack_ffffffffffffff38,str);
      value.m_size = (size_t)pQVar3;
      value.field_0.m_data = in_RCX.m_data;
      QHttpHeaders::append
                ((QHttpHeaders *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                 in_stack_ffffffffffffff44,value);
    }
    QNetworkRequest::setHeaders
              ((QNetworkRequest *)in_stack_ffffffffffffff30,
               (QHttpHeaders *)in_stack_ffffffffffffff28);
    in_stack_ffffffffffffff30 = in_RDI[0x10].d.d.ptr;
    QJsonDocument::toJson((JsonFormat)local_68);
    qxp::detail::
    function_ref_base<false,_const_void,_QNetworkReply_*,_QNetworkAccessManager_*,_const_QNetworkRequest_&,_const_QByteArray_&>
    ::operator()((function_ref_base<false,_const_void,_QNetworkReply_*,_QNetworkAccessManager_*,_const_QNetworkRequest_&,_const_QByteArray_&>
                  *)in_stack_ffffffffffffff38,
                 (QNetworkAccessManager *)
                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                 (QNetworkRequest *)in_stack_ffffffffffffff30,
                 (QByteArray *)in_stack_ffffffffffffff28);
    QByteArray::~QByteArray((QByteArray *)0x330446);
    std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>::unique_ptr
              ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
               in_stack_ffffffffffffff30,
               (unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
               in_stack_ffffffffffffff28);
    local_78 = createActiveRequest(in_stack_ffffffffffffffc0,in_stack_00000038,
                                   in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>::~unique_ptr
              ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
               in_stack_ffffffffffffff30);
    QHttpHeaders::~QHttpHeaders((QHttpHeaders *)0x3304b3);
    QNetworkRequest::~QNetworkRequest((QNetworkRequest *)in_stack_ffffffffffffff30);
  }
  std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>::~unique_ptr
            ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
             in_stack_ffffffffffffff30);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_78;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkReply *executeRequest(ReqOpRefJson requestOperation, const QJsonDocument &jsonDoc,
                               const QNetworkRequest &request,
                               const QObject *context, QtPrivate::QSlotObjectBase *rawSlot)
    {
        QtPrivate::SlotObjUniquePtr slot(rawSlot);
        if (!qnam)
            return warnNoAccessManager();
        verifyThreadAffinity(context);
        QNetworkRequest req(request);
        auto h = req.headers();
        if (!h.contains(QHttpHeaders::WellKnownHeader::ContentType)) {
            h.append(QHttpHeaders::WellKnownHeader::ContentType,
                     QLatin1StringView{"application/json"});
        }
        req.setHeaders(std::move(h));
        QNetworkReply *reply = requestOperation(qnam, req, jsonDoc.toJson(QJsonDocument::Compact));
        return createActiveRequest(reply, context, std::move(slot));
    }